

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperSTRCASEEQ
          (internal *this,char *lhs_expression,char *rhs_expression,char *lhs,char *rhs)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char **value;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  bool bVar2;
  AssertionResult AVar3;
  char *local_68;
  char *local_60;
  string local_58;
  string local_38;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  value_00;
  
  bVar2 = rhs == (char *)0x0;
  value_00._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rhs_expression;
  local_68 = rhs;
  local_60 = lhs;
  if (lhs == (char *)0x0) {
LAB_001fcaf7:
    if (bVar2) {
      *this = (internal)0x1;
      *(undefined8 *)(this + 8) = 0;
      goto LAB_001fcb78;
    }
  }
  else if (rhs != (char *)0x0) {
    iVar1 = strcasecmp(lhs,rhs);
    bVar2 = iVar1 == 0;
    value_00._M_head_impl = extraout_RDX;
    goto LAB_001fcaf7;
  }
  PrintToString<char_const*>(&local_38,(testing *)&local_60,(char **)value_00._M_head_impl);
  PrintToString<char_const*>(&local_58,(testing *)&local_68,value);
  AVar3 = EqFailure(this,lhs_expression,rhs_expression,&local_38,&local_58,true);
  value_00._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    value_00 = extraout_RDX_00.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    value_00._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
LAB_001fcb78:
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )value_00._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTRCASEEQ(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const char* lhs,
                                   const char* rhs) {
  if (String::CaseInsensitiveCStringEquals(lhs, rhs)) {
    return AssertionSuccess();
  }

  return EqFailure(lhs_expression,
                   rhs_expression,
                   PrintToString(lhs),
                   PrintToString(rhs),
                   true);
}